

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

Sfm_Tim_t * Sfm_TimStart(Mio_Library_t *pLib,Scl_Con_t *pExt,Abc_Ntk_t *pNtk,int DeltaCrit)

{
  int iVar1;
  Sfm_Tim_t *p;
  
  p = (Sfm_Tim_t *)calloc(1,0x70);
  p->pLib = pLib;
  p->pExt = pExt;
  p->pNtk = pNtk;
  Vec_IntFill(&p->vTimArrs,pNtk->vObjs->nSize * 3,0);
  Vec_IntFill(&p->vTimReqs,pNtk->vObjs->nSize * 3,0);
  iVar1 = Sfm_TimTrace(p);
  p->Delay = iVar1;
  if (DeltaCrit - 1U < 999999) {
    p->DeltaCrit = DeltaCrit;
    return p;
  }
  __assert_fail("DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                ,0xee,"Sfm_Tim_t *Sfm_TimStart(Mio_Library_t *, Scl_Con_t *, Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Tim_t * Sfm_TimStart( Mio_Library_t * pLib, Scl_Con_t * pExt, Abc_Ntk_t * pNtk, int DeltaCrit )
{
    Sfm_Tim_t * p = ABC_CALLOC( Sfm_Tim_t, 1 );
    p->pLib = pLib;
    p->pExt = pExt;
    p->pNtk = pNtk;
    Vec_IntFill( &p->vTimArrs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    Vec_IntFill( &p->vTimReqs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    p->Delay = Sfm_TimTrace( p );
    assert( DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0) );
    p->DeltaCrit = DeltaCrit;
    return p;
}